

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall
AmpIO::WriteRobotLED(AmpIO *this,uint32_t rgb1,uint32_t rgb2,bool blink1,bool blink2)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if ((uVar2 == 0x64524131) &&
     (pBVar1 = (this->super_FpgaIO).super_BoardIO.port, pBVar1 != (BasePort *)0x0)) {
    iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa001,
                       (ulong)((uint)blink2 << 0x1f |
                              (rgb2 & 0xf0) << 0xc |
                              (rgb2 & 0xf000) << 9 |
                              (rgb2 & 0xf00000) << 6 |
                              (uint)blink1 << 0xf |
                              rgb1 >> 4 & 0xf | rgb1 >> 7 & 0x1e0 | rgb1 >> 10 & 0x3c00));
    return SUB41(iVar3,0);
  }
  return false;
}

Assistant:

bool AmpIO::WriteRobotLED(uint32_t rgb1, uint32_t rgb2, bool blink1, bool blink2) const
{
    if (GetHardwareVersion() == dRA1_String) {
        uint8_t r1 = (rgb1 >> 20) & 0xF;
        uint8_t g1 = (rgb1 >> 12) & 0xF;
        uint8_t b1 = (rgb1 >> 4) & 0xF;
        uint8_t r2 = (rgb2 >> 20) & 0xF;
        uint8_t g2 = (rgb2 >> 12) & 0xF;
        uint8_t b2 = (rgb2 >> 4) & 0xF;
        uint32_t command = (r1 << 10) | (g1 << 5) | (b1 << 0) | (blink1 << 15) | (r2 << 26) | (g2 << 21) | (b2 << 16) | (blink2 << 31) ;
        return (port ? port->WriteQuadlet(BoardId, 0xa001, command) : false);
    }
    return false;
}